

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_5;
  ExternUdpDeclSyntax *pEVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_69;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_68 = deepClone<slang::syntax::AttributeInstanceSyntax>
                       ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                        (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x60),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xb8),&local_69,(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::UdpPortListSyntax&>
                     ((BumpAllocator *)__child_stack,local_68,&local_40,args_2,&local_50,&local_60,
                      (UdpPortListSyntax *)args_5);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternUdpDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternUdpDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        *deepClone(node.actualAttributes, alloc),
        node.primitive.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone<UdpPortListSyntax>(*node.portList, alloc)
    );
}